

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_get_u64_decimal(CBS *cbs,uint64_t *out)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  uint c;
  ulong uVar6;
  bool bVar7;
  
  if (cbs->len != 0) {
    c = (uint)*cbs->data;
    iVar3 = OPENSSL_isdigit((uint)*cbs->data);
    if (iVar3 != 0) {
      uVar6 = 0;
      bVar1 = 0;
      do {
        if (cbs->len == 0) {
          bVar7 = true;
        }
        else {
          cbs->data = cbs->data + 1;
          sVar5 = cbs->len - 1;
          bVar7 = sVar5 == 0;
          cbs->len = sVar5;
        }
        if (0x1999999999999999 < uVar6) {
          return 0;
        }
        if ((bool)(uVar6 == 0 & bVar1)) {
          return 0;
        }
        uVar2 = uVar6 * 10;
        uVar6 = (long)(int)(c - 0x30) + uVar2;
        if (CARRY8((long)(int)(c - 0x30),uVar2)) {
          return 0;
        }
        iVar3 = 1;
        if (bVar7) break;
        c = (uint)*cbs->data;
        iVar4 = OPENSSL_isdigit(c);
        bVar1 = 1;
      } while (iVar4 != 0);
      goto LAB_0017682b;
    }
  }
  uVar6 = 0;
  iVar3 = 0;
LAB_0017682b:
  *out = uVar6;
  return iVar3;
}

Assistant:

int CBS_get_u64_decimal(CBS *cbs, uint64_t *out) {
  uint64_t v = 0;
  int seen_digit = 0;
  while (CBS_len(cbs) != 0) {
    uint8_t c = CBS_data(cbs)[0];
    if (!OPENSSL_isdigit(c)) {
      break;
    }
    CBS_skip(cbs, 1);
    if (/* Forbid stray leading zeros */
        (v == 0 && seen_digit) ||
        // Check for overflow.
        v > UINT64_MAX / 10 ||  //
        v * 10 > UINT64_MAX - (c - '0')) {
      return 0;
    }
    v = v * 10 + (c - '0');
    seen_digit = 1;
  }

  *out = v;
  return seen_digit;
}